

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int banner_receive(LIBSSH2_SESSION *session)

{
  undefined8 uVar1;
  size_t banner_len_00;
  bool bVar2;
  char local_31;
  size_t sStack_30;
  char c;
  size_t banner_len;
  long lStack_20;
  int rc;
  ssize_t ret;
  LIBSSH2_SESSION *session_local;
  
  ret = (ssize_t)session;
  if (session->banner_TxRx_state == libssh2_NB_state_idle) {
    sStack_30 = 0;
    if ((session->remote).banner != (uchar *)0x0) {
      (*session->free)((session->remote).banner,&session->abstract);
    }
    *(undefined8 *)(ret + 0x140) = 0;
    *(undefined4 *)(ret + 0x11448) = 2;
  }
  else {
    sStack_30 = session->banner_TxRx_total_send;
  }
  do {
    do {
      local_31 = '\0';
      *(uint *)(ret + 0x260) = *(uint *)(ret + 0x260) & 0xfffffffe;
      uVar1 = 0x4000;
      if (*(int *)(ret + 0x84) != 0) {
        uVar1 = 0;
      }
      lStack_20 = (**(code **)(ret + 0x68))(*(undefined4 *)(ret + 600),&local_31,1,uVar1,ret);
      if (lStack_20 < 0) {
        if (lStack_20 == -0xb) {
          *(undefined4 *)(ret + 0x260) = 1;
          *(size_t *)(ret + 0x11550) = sStack_30;
          return -0x25;
        }
        *(undefined4 *)(ret + 0x11448) = 0;
        *(undefined8 *)(ret + 0x11550) = 0;
        return -0x2b;
      }
      if (lStack_20 == 0) {
        *(undefined4 *)(ret + 0x25c) = 0xffffffff;
        return -0xd;
      }
    } while ((((local_31 == '\r') || (local_31 == '\n')) && (sStack_30 == 0)) &&
            (*(long *)(ret + 0x140) == 0));
    if (local_31 == '\0') {
      *(undefined4 *)(ret + 0x11448) = 0;
      *(undefined8 *)(ret + 0x11550) = 0;
      return -2;
    }
    if (0xff < sStack_30) {
      banner_len._4_4_ = collect_remote_banner((LIBSSH2_SESSION *)ret,sStack_30);
      if (banner_len._4_4_ < 0) {
        return banner_len._4_4_;
      }
      sStack_30 = 0;
    }
    banner_len_00 = sStack_30 + 1;
    *(char *)(ret + 0x1144c + sStack_30) = local_31;
    sStack_30 = banner_len_00;
  } while (local_31 != '\n');
  banner_len._4_4_ = collect_remote_banner((LIBSSH2_SESSION *)ret,banner_len_00);
  session_local._4_4_ = banner_len._4_4_;
  if (-1 < banner_len._4_4_) {
    sStack_30 = strlen(*(char **)(ret + 0x140));
    while( true ) {
      bVar2 = false;
      if ((sStack_30 != 0) &&
         (bVar2 = true, *(char *)(*(long *)(ret + 0x140) + (sStack_30 - 1)) != '\n')) {
        bVar2 = *(char *)(*(long *)(ret + 0x140) + (sStack_30 - 1)) == '\r';
      }
      if (!bVar2) break;
      *(undefined1 *)(*(long *)(ret + 0x140) + (sStack_30 - 1)) = 0;
      sStack_30 = sStack_30 - 1;
    }
    *(undefined4 *)(ret + 0x11448) = 0;
    *(undefined8 *)(ret + 0x11550) = 0;
    if (sStack_30 == 0) {
      session_local._4_4_ = -2;
    }
    else {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
banner_receive(LIBSSH2_SESSION * session)
{
    ssize_t ret;
    int rc;
    size_t banner_len;

    if(session->banner_TxRx_state == libssh2_NB_state_idle) {
        banner_len = 0;

        if(session->remote.banner)
          LIBSSH2_FREE(session, session->remote.banner);
        session->remote.banner = NULL;

        session->banner_TxRx_state = libssh2_NB_state_created;
    }
    else {
        banner_len = session->banner_TxRx_total_send;
    }

    for(;;) {
        char c = '\0';

        /* no incoming block yet! */
        session->socket_block_directions &= ~LIBSSH2_SESSION_BLOCK_INBOUND;

        ret = LIBSSH2_RECV(session, &c, 1,
                           LIBSSH2_SOCKET_RECV_FLAGS(session));
        if(ret < 0) {
            if(session->api_block_mode || (ret != -EAGAIN))
                /* ignore EAGAIN when non-blocking */
                _libssh2_debug((session, LIBSSH2_TRACE_SOCKET,
                               "Error recving %d bytes: %ld", 1, (long)-ret));
        }
        else
            _libssh2_debug((session, LIBSSH2_TRACE_SOCKET,
                           "Recved %ld bytes banner for a total %ld", 
                           (long)ret, (long)(1 + banner_len)));

        if(ret < 0) {
            if(ret == -EAGAIN) {
                session->socket_block_directions =
                    LIBSSH2_SESSION_BLOCK_INBOUND;
                session->banner_TxRx_total_send = banner_len;
                return LIBSSH2_ERROR_EAGAIN;
            }

            /* Some kinda error */
            session->banner_TxRx_state = libssh2_NB_state_idle;
            session->banner_TxRx_total_send = 0;
            return LIBSSH2_ERROR_SOCKET_RECV;
        }

        if(ret == 0) {
            session->socket_state = LIBSSH2_SOCKET_DISCONNECTED;
            return LIBSSH2_ERROR_SOCKET_DISCONNECT;
        }

        /* Ignore leading newline characters */
        if((c == '\r' || c == '\n') && banner_len == 0 && 
            !session->remote.banner) {
            continue;
        }

        if(c == '\0') {
            /* NULLs are not allowed in SSH banners */
            session->banner_TxRx_state = libssh2_NB_state_idle;
            session->banner_TxRx_total_send = 0;
            return LIBSSH2_ERROR_BANNER_RECV;
        }

        /* make sure we don't overflow banner_TxRx_banner */
        if(banner_len >= sizeof(session->banner_TxRx_banner)) {
            rc = collect_remote_banner(session, banner_len);
            if(rc < 0) return rc;
            banner_len = 0;
        }

        session->banner_TxRx_banner[banner_len++] = c;

        if(c == '\n') break;
    }

    rc = collect_remote_banner(session, banner_len);
    if(rc < 0) return rc;
    banner_len = strlen((char const*)session->remote.banner);

    /* Ignore trailing newline characters */
    while(banner_len &&
          ((session->remote.banner[banner_len - 1] == '\n') ||
           (session->remote.banner[banner_len - 1] == '\r'))) {
        session->remote.banner[banner_len - 1] = '\0';
        banner_len--;
    }

    /* From this point on, we are done here */
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;

    if(!banner_len)
        return LIBSSH2_ERROR_BANNER_RECV;

    _libssh2_debug((session, LIBSSH2_TRACE_TRANS, "Received Banner: %s",
                   session->remote.banner));
    return LIBSSH2_ERROR_NONE;
}